

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O0

void * __thiscall
btSortedOverlappingPairCache::removeOverlappingPair
          (btSortedOverlappingPairCache *this,btBroadphaseProxy *proxy0,btBroadphaseProxy *proxy1,
          btDispatcher *dispatcher)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  btBroadphasePair *pbVar4;
  undefined8 in_RCX;
  btBroadphaseProxy *in_RDX;
  btBroadphaseProxy *in_RSI;
  btBroadphasePair *in_RDI;
  void *userData;
  btBroadphasePair *pair;
  int findIndex;
  btBroadphasePair findPair;
  btAlignedObjectArray<btBroadphasePair> *in_stack_ffffffffffffffa0;
  anon_union_8_2_ea5a2114_for_btBroadphasePair_3 aVar5;
  undefined4 in_stack_ffffffffffffffb0;
  int n;
  btBroadphasePair local_48;
  undefined8 local_28;
  btBroadphaseProxy *local_20;
  btBroadphaseProxy *local_18;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  uVar3 = (**(code **)(in_RDI->m_pProxy0[1].m_aabbMax.m_floats + 1))();
  if ((uVar3 & 1) == 0) {
    btBroadphasePair::btBroadphasePair(&local_48,local_18,local_20);
    iVar1 = btAlignedObjectArray<btBroadphasePair>::findLinearSearch
                      (in_stack_ffffffffffffffa0,in_RDI);
    n = iVar1;
    iVar2 = btAlignedObjectArray<btBroadphasePair>::size
                      ((btAlignedObjectArray<btBroadphasePair> *)&in_RDI->m_pProxy1);
    if (iVar1 < iVar2) {
      gOverlappingPairs = gOverlappingPairs + -1;
      pbVar4 = btAlignedObjectArray<btBroadphasePair>::operator[]
                         ((btAlignedObjectArray<btBroadphasePair> *)&in_RDI->m_pProxy1,n);
      aVar5 = pbVar4->field_3;
      (*(code *)in_RDI->m_pProxy0[1].m_clientObject)(in_RDI,pbVar4,local_28);
      if (in_RDI[1].field_3.m_internalInfo1 != (void *)0x0) {
        (**(code **)(*in_RDI[1].field_3.m_internalInfo1 + 0x18))
                  (in_RDI[1].field_3.m_internalInfo1,local_18,local_20,local_28);
      }
      btAlignedObjectArray<btBroadphasePair>::capacity
                ((btAlignedObjectArray<btBroadphasePair> *)&in_RDI->m_pProxy1);
      btAlignedObjectArray<btBroadphasePair>::swap
                ((btAlignedObjectArray<btBroadphasePair> *)CONCAT44(n,in_stack_ffffffffffffffb0),
                 (int)((ulong)pbVar4 >> 0x20),(int)pbVar4);
      btAlignedObjectArray<btBroadphasePair>::pop_back
                ((btAlignedObjectArray<btBroadphasePair> *)&in_RDI->m_pProxy1);
      return aVar5.m_internalInfo1;
    }
  }
  return (void *)0x0;
}

Assistant:

void*	btSortedOverlappingPairCache::removeOverlappingPair(btBroadphaseProxy* proxy0,btBroadphaseProxy* proxy1, btDispatcher* dispatcher )
{
	if (!hasDeferredRemoval())
	{
		btBroadphasePair findPair(*proxy0,*proxy1);

		int findIndex = m_overlappingPairArray.findLinearSearch(findPair);
		if (findIndex < m_overlappingPairArray.size())
		{
			gOverlappingPairs--;
			btBroadphasePair& pair = m_overlappingPairArray[findIndex];
			void* userData = pair.m_internalInfo1;
			cleanOverlappingPair(pair,dispatcher);
			if (m_ghostPairCallback)
				m_ghostPairCallback->removeOverlappingPair(proxy0, proxy1,dispatcher);
			
			m_overlappingPairArray.swap(findIndex,m_overlappingPairArray.capacity()-1);
			m_overlappingPairArray.pop_back();
			return userData;
		}
	}

	return 0;
}